

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite34_Test<absl::lts_20250127::Cord>::
~LiteTest_AllLite34_Test(LiteTest_AllLite34_Test<absl::lts_20250127::Cord> *this)

{
  LiteTest_AllLite34_Test<absl::lts_20250127::Cord> *this_local;
  
  ~LiteTest_AllLite34_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite34) {
  {
    // UnorderedWireFormat
    proto2_unittest::TestMapLite message;

    // put value before key in wire format
    std::string data = "\x0A\x04\x10\x01\x08\x02";

    EXPECT_TRUE(message.ParseFromString(data));
    ASSERT_EQ(1, message.map_int32_int32().size());
    ASSERT_NE(message.map_int32_int32().find(2),
              message.map_int32_int32().end());
    EXPECT_EQ(1, message.map_int32_int32().at(2));
  }
}